

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

Block * __thiscall
Js::CompoundString::Block::Clone(Block *this,CharCount usedCharLength,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  Block *this_00;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler_local;
  Block *pBStack_10;
  CharCount usedCharLength_local;
  Block *this_local;
  
  local_20 = recycler;
  recycler_local._4_4_ = usedCharLength;
  pBStack_10 = this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x57,"(recycler)","recycler");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = local_20;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
             ,0x59);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_48);
  this_00 = (Block *)new<Memory::Recycler>(0x18,pRVar4,0x43c4b0);
  Block(this_00,this,recycler_local._4_4_);
  return this_00;
}

Assistant:

CompoundString::Block *CompoundString::Block::Clone(
        const CharCount usedCharLength,
        Recycler *const recycler) const
    {
        Assert(recycler);

        return RecyclerNew(recycler, Block, *this, usedCharLength);
    }